

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O1

void av1_setup_motion_field(AV1_COMMON *cm)

{
  SequenceHeader *pSVar1;
  TPL_MV_REF *pTVar2;
  bool bVar3;
  int ref_idx;
  int iVar4;
  long lVar5;
  uint uVar6;
  RefCntBuffer *pRVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  int ref_order_hint [7];
  RefCntBuffer *ref_buf [7];
  uint local_78 [8];
  long local_58 [7];
  
  pSVar1 = cm->seq_params;
  if ((pSVar1->order_hint_info).enable_order_hint != 0) {
    uVar6 = ((cm->mi_params).mi_stride >> 1) * ((cm->mi_params).mi_rows + 0x20 >> 1);
    if (0 < (int)uVar6) {
      pTVar2 = cm->tpl_mvs;
      uVar9 = 0;
      do {
        pTVar2[uVar9].mfmv0.as_int = 0x80008000;
        pTVar2[uVar9].ref_frame_offset = '\0';
        uVar9 = uVar9 + 1;
      } while (uVar6 != uVar9);
    }
    uVar6 = cm->cur_frame->order_hint;
    lVar5 = 0;
    do {
      if ((long)cm->remapped_ref_idx[lVar5] == -1) {
        pRVar7 = (RefCntBuffer *)0x0;
      }
      else {
        pRVar7 = cm->ref_frame_map[cm->remapped_ref_idx[lVar5]];
      }
      if (pRVar7 == (RefCntBuffer *)0x0) {
        uVar8 = 0;
      }
      else {
        uVar8 = pRVar7->order_hint;
      }
      local_58[lVar5] = (long)pRVar7;
      local_78[lVar5] = uVar8;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 7);
    if (local_58[0] == 0) {
      iVar10 = 2;
    }
    else {
      iVar10 = 1;
      if (*(int *)(local_58[0] + 0x20) != local_78[3]) {
        motion_field_projection(cm,'\x01',2);
      }
    }
    if (((pSVar1->order_hint_info).enable_order_hint != 0) &&
       (uVar8 = 1 << ((byte)(pSVar1->order_hint_info).order_hint_bits_minus_1 & 0x1f),
       (int)(uVar8 & local_78[4] - uVar6) < (int)(uVar8 - 1 & local_78[4] - uVar6))) {
      iVar4 = motion_field_projection(cm,'\x05',0);
      iVar10 = iVar10 - iVar4;
    }
    if (((pSVar1->order_hint_info).enable_order_hint != 0) &&
       (uVar8 = 1 << ((byte)(pSVar1->order_hint_info).order_hint_bits_minus_1 & 0x1f),
       (int)(uVar8 & local_78[5] - uVar6) < (int)(uVar8 - 1 & local_78[5] - uVar6))) {
      iVar4 = motion_field_projection(cm,'\x06',0);
      iVar10 = iVar10 - iVar4;
    }
    if ((pSVar1->order_hint_info).enable_order_hint == 0) {
      bVar3 = false;
    }
    else {
      uVar8 = 1 << ((byte)(pSVar1->order_hint_info).order_hint_bits_minus_1 & 0x1f);
      bVar3 = (int)(uVar8 & local_78[6] - uVar6) < (int)(uVar8 - 1 & local_78[6] - uVar6);
    }
    if ((bVar3) && (-1 < iVar10)) {
      iVar4 = motion_field_projection(cm,'\a',0);
      iVar10 = iVar10 - iVar4;
    }
    if (-1 < iVar10) {
      motion_field_projection(cm,'\x02',2);
    }
  }
  return;
}

Assistant:

void av1_setup_motion_field(AV1_COMMON *cm) {
  const OrderHintInfo *const order_hint_info = &cm->seq_params->order_hint_info;

  if (!order_hint_info->enable_order_hint) return;

  TPL_MV_REF *tpl_mvs_base = cm->tpl_mvs;
  int size = ((cm->mi_params.mi_rows + MAX_MIB_SIZE) >> 1) *
             (cm->mi_params.mi_stride >> 1);
  for (int idx = 0; idx < size; ++idx) {
    tpl_mvs_base[idx].mfmv0.as_int = INVALID_MV;
    tpl_mvs_base[idx].ref_frame_offset = 0;
  }

  const int cur_order_hint = cm->cur_frame->order_hint;
  const RefCntBuffer *ref_buf[INTER_REFS_PER_FRAME];
  int ref_order_hint[INTER_REFS_PER_FRAME];

  for (int ref_frame = LAST_FRAME; ref_frame <= ALTREF_FRAME; ref_frame++) {
    const int ref_idx = ref_frame - LAST_FRAME;
    const RefCntBuffer *const buf = get_ref_frame_buf(cm, ref_frame);
    int order_hint = 0;

    if (buf != NULL) order_hint = buf->order_hint;

    ref_buf[ref_idx] = buf;
    ref_order_hint[ref_idx] = order_hint;
  }

  int ref_stamp = MFMV_STACK_SIZE - 1;

  if (ref_buf[LAST_FRAME - LAST_FRAME] != NULL) {
    const int alt_of_lst_order_hint =
        ref_buf[LAST_FRAME - LAST_FRAME]
            ->ref_order_hints[ALTREF_FRAME - LAST_FRAME];

    const int is_lst_overlay =
        (alt_of_lst_order_hint == ref_order_hint[GOLDEN_FRAME - LAST_FRAME]);
    if (!is_lst_overlay) motion_field_projection(cm, LAST_FRAME, 2);
    --ref_stamp;
  }

  if (get_relative_dist(order_hint_info,
                        ref_order_hint[BWDREF_FRAME - LAST_FRAME],
                        cur_order_hint) > 0) {
    if (motion_field_projection(cm, BWDREF_FRAME, 0)) --ref_stamp;
  }

  if (get_relative_dist(order_hint_info,
                        ref_order_hint[ALTREF2_FRAME - LAST_FRAME],
                        cur_order_hint) > 0) {
    if (motion_field_projection(cm, ALTREF2_FRAME, 0)) --ref_stamp;
  }

  if (get_relative_dist(order_hint_info,
                        ref_order_hint[ALTREF_FRAME - LAST_FRAME],
                        cur_order_hint) > 0 &&
      ref_stamp >= 0)
    if (motion_field_projection(cm, ALTREF_FRAME, 0)) --ref_stamp;

  if (ref_stamp >= 0) motion_field_projection(cm, LAST2_FRAME, 2);
}